

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O0

cl_uint __thiscall CLIntercept::getRefCount(CLIntercept *this,cl_command_queue queue)

{
  cl_icd_dispatch *pcVar1;
  cl_command_queue in_RSI;
  CLIntercept *in_RDI;
  cl_uint refCount;
  cl_uint local_14;
  cl_command_queue local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  pcVar1 = dispatch(in_RDI);
  (*pcVar1->clGetCommandQueueInfo)(local_10,0x1092,4,&local_14,(size_t *)0x0);
  return local_14;
}

Assistant:

inline cl_uint CLIntercept::getRefCount( cl_command_queue queue ) const
{
    cl_uint refCount = 0;
    dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_REFERENCE_COUNT,
        sizeof(refCount),
        &refCount,
        NULL);
    return refCount;
}